

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::MovableMessageTest_MoveFromArena_Test::
MovableMessageTest_MoveFromArena_Test(MovableMessageTest_MoveFromArena_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0164ec18;
  return;
}

Assistant:

TEST(MovableMessageTest, MoveFromArena) {
  Arena arena;

  auto* message1_on_arena =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena);
  TestUtil::SetAllFields(message1_on_arena);
  const auto* nested = &message1_on_arena->optional_nested_message();

  proto2_unittest::TestAllTypes message2;

  // Moving from a message on the arena should lead to a copy.
  message2 = std::move(*message1_on_arena);
  EXPECT_NE(nested, &message2.optional_nested_message());
  TestUtil::ExpectAllFieldsSet(*message1_on_arena);
  TestUtil::ExpectAllFieldsSet(message2);
}